

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conf.c
# Opt level: O3

void conf_copy_into(Conf *newconf,Conf *oldconf)

{
  int iVar1;
  int *piVar2;
  int *e;
  char *pcVar3;
  FontSpec *pFVar4;
  int index;
  
  conf_clear(newconf);
  piVar2 = (int *)index234(oldconf->tree,0);
  if (piVar2 != (int *)0x0) {
    index = 1;
    do {
      e = (int *)safemalloc(1,0x18,0);
      iVar1 = *piVar2;
      *e = iVar1;
      if (subkeytypes[iVar1] == 3) {
        pcVar3 = dupstr(*(char **)(piVar2 + 2));
        *(char **)(e + 2) = pcVar3;
      }
      else if (subkeytypes[iVar1] == 2) {
        e[2] = piVar2[2];
      }
      switch(valuetypes[*piVar2]) {
      case 1:
        *(char *)(e + 4) = (char)piVar2[4];
        break;
      case 2:
        e[4] = piVar2[4];
        break;
      case 3:
        pFVar4 = (FontSpec *)dupstr(*(char **)(piVar2 + 4));
        goto LAB_0011ce57;
      case 4:
        pFVar4 = (FontSpec *)filename_copy(*(Filename **)(piVar2 + 4));
        goto LAB_0011ce57;
      case 5:
        pFVar4 = fontspec_copy(*(FontSpec **)(piVar2 + 4));
LAB_0011ce57:
        *(FontSpec **)(e + 4) = pFVar4;
      }
      add234(newconf->tree,e);
      piVar2 = (int *)index234(oldconf->tree,index);
      index = index + 1;
    } while (piVar2 != (int *)0x0);
  }
  return;
}

Assistant:

void conf_copy_into(Conf *newconf, Conf *oldconf)
{
    struct conf_entry *entry, *entry2;
    int i;

    conf_clear(newconf);

    for (i = 0; (entry = index234(oldconf->tree, i)) != NULL; i++) {
        entry2 = snew(struct conf_entry);
        copy_key(&entry2->key, &entry->key);
        copy_value(&entry2->value, &entry->value,
                   valuetypes[entry->key.primary]);
        add234(newconf->tree, entry2);
    }
}